

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O0

void __thiscall
utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
Initialize(NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int> *this
          ,char **src,size_t srcCount)

{
  size_t local_20;
  size_t srcCount_local;
  char **src_local;
  NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int> *this_local;
  
  local_20 = srcCount;
  if (srcCount == 0xffffffffffffffff) {
    local_20 = NarrowWideStringConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
               ::Length(*src);
  }
  NarrowWideStringConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::Convert
            (*src,local_20,&this->dst,&this->dstCount,&this->allocateCount);
  this->freeDst = true;
  return;
}

Assistant:

void Initialize(const SrcType& src, size_t srcCount = -1)
        {
            if (srcCount == -1)
            {
                srcCount = StringConverter::Length(src);
            }

            StringConverter::Convert(src, srcCount, &dst, &dstCount, &allocateCount);
            freeDst = true;
        }